

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O3

TPZSkylMatrix<std::complex<double>_> * __thiscall
TPZSkylMatrix<std::complex<double>_>::NewMatrix(TPZSkylMatrix<std::complex<double>_> *this)

{
  TPZSkylMatrix<std::complex<double>_> *pTVar1;
  
  pTVar1 = (TPZSkylMatrix<std::complex<double>_> *)operator_new(0x60);
  (pTVar1->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = 0;
  (pTVar1->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = 0;
  (pTVar1->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (pTVar1->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (pTVar1->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_01853230;
  (pTVar1->fElem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01855428;
  (pTVar1->fElem).fStore = (complex<double> **)0x0;
  (pTVar1->fElem).fNElements = 0;
  (pTVar1->fElem).fNAlloc = 0;
  (pTVar1->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  (pTVar1->fStorage).fStore = (complex<double> *)0x0;
  (pTVar1->fStorage).fNElements = 0;
  (pTVar1->fStorage).fNAlloc = 0;
  return pTVar1;
}

Assistant:

inline TPZSkylMatrix<TVar>*NewMatrix() const override {return new TPZSkylMatrix<TVar>{};}